

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_cpio.c
# Opt level: O1

void test_compat_cpio(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *pcVar4;
  time_t tVar5;
  la_int64_t lVar6;
  archive_entry *ae;
  char name [24];
  archive_entry *local_50;
  char local_48 [24];
  
  builtin_strncpy(local_48,"test_compat_cpio_1.cpio",0x18);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                   ,L'1',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file(local_48);
  wVar2 = archive_read_open_filename(a,local_48,0x11);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'5',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 17)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_50);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
             ,L'9',"foo1","\"foo1\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar4 = archive_entry_hardlink(local_50);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
             ,L':',(char *)0x0,"NULL",pcVar4,"archive_entry_hardlink(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L';',0x4b1de474,"1260250228",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_uid(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'<',1000,"1000",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  lVar6 = archive_entry_gid(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'=',1000,"1000",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'>',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_50);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
             ,L'B',"foo2","\"foo2\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar4 = archive_entry_hardlink(local_50);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
             ,L'C',(char *)0x0,"NULL",pcVar4,"archive_entry_hardlink(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'D',0x4b1de474,"1260250228",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_uid(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'E',1000,"1000",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  lVar6 = archive_entry_gid(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'F',1000,"1000",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'G',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_50);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
             ,L'K',"bar1","\"bar1\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar4 = archive_entry_hardlink(local_50);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
             ,L'L',(char *)0x0,"NULL",pcVar4,"archive_entry_hardlink(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'M',0x4b1de474,"1260250228",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_uid(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'N',1000,"1000",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  lVar6 = archive_entry_gid(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'O',1000,"1000",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'P',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'S',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_50);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
             ,L'T',"bar2","\"bar2\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar4 = archive_entry_hardlink(local_50);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
             ,L'U',"bar1","\"bar1\"",pcVar4,"archive_entry_hardlink(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'V',0x4b1de474,"1260250228",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_uid(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'W',1000,"1000",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  lVar6 = archive_entry_gid(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'X',1000,"1000",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'Y',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  iVar1 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'\\',(long)iVar1,"archive_filter_code(a, 0)",0,"ARCHIVE_FILTER_NONE",
                      (void *)0x0);
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L']',(long)iVar1,"archive_format(a)",0x10004,"ARCHIVE_FORMAT_CPIO_SVR4_NOCRC"
                      ,(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_cpio.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_compat_cpio_1(void)
{
	char name[] = "test_compat_cpio_1.cpio";
	struct archive_entry *ae;
	struct archive *a;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 17));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("foo1", archive_entry_pathname(ae));
	assertEqualString(NULL, archive_entry_hardlink(ae));
	assertEqualInt(1260250228, archive_entry_mtime(ae));
	assertEqualInt(1000, archive_entry_uid(ae));
	assertEqualInt(1000, archive_entry_gid(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	/* Read second entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("foo2", archive_entry_pathname(ae));
	assertEqualString(NULL, archive_entry_hardlink(ae));
	assertEqualInt(1260250228, archive_entry_mtime(ae));
	assertEqualInt(1000, archive_entry_uid(ae));
	assertEqualInt(1000, archive_entry_gid(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	/* Read third entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("bar1", archive_entry_pathname(ae));
	assertEqualString(NULL, archive_entry_hardlink(ae));
	assertEqualInt(1260250228, archive_entry_mtime(ae));
	assertEqualInt(1000, archive_entry_uid(ae));
	assertEqualInt(1000, archive_entry_gid(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	/* Read fourth entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("bar2", archive_entry_pathname(ae));
	assertEqualString("bar1", archive_entry_hardlink(ae));
	assertEqualInt(1260250228, archive_entry_mtime(ae));
	assertEqualInt(1000, archive_entry_uid(ae));
	assertEqualInt(1000, archive_entry_gid(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_NONE);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_CPIO_SVR4_NOCRC);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}